

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O0

void __thiscall
duckdb::MultiFileFunction<duckdb::CSVMultiFileInfo>::MultiFileFunction
          (MultiFileFunction<duckdb::CSVMultiFileInfo> *this,string *name_p)

{
  string *in_RSI;
  undefined8 *in_RDI;
  TableFunction *in_stack_00000100;
  allocator_type *in_stack_ffffffffffffff18;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff20;
  initializer_list<duckdb::LogicalType> in_stack_ffffffffffffff28;
  LogicalTypeId in_stack_ffffffffffffff3f;
  LogicalType *in_stack_ffffffffffffff40;
  undefined1 *local_a0;
  undefined1 local_70 [8];
  table_function_init_global_t in_stack_ffffffffffffff98;
  table_function_bind_t in_stack_ffffffffffffffa0;
  table_function_t function;
  vector<duckdb::LogicalType,_true> *arguments;
  string *in_stack_ffffffffffffffb8;
  TableFunction *in_stack_ffffffffffffffc0;
  table_function_init_local_t in_stack_ffffffffffffffd0;
  
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,in_RSI);
  LogicalType::LogicalType(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  function = (table_function_t)local_70;
  arguments = (vector<duckdb::LogicalType,_true> *)0x1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x14aa40f);
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff18);
  TableFunction::TableFunction
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,arguments,function,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffffd0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x14aa47e);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x14aa488);
  local_a0 = &stack0xffffffffffffffa8;
  do {
    local_a0 = local_a0 + -0x18;
    LogicalType::~LogicalType((LogicalType *)0x14aa4ae);
  } while (local_a0 != local_70);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  *in_RDI = &PTR__MultiFileFunction_0351e5d0;
  in_RDI[0x23] = MultiFileCardinality;
  in_RDI[0x28] = MultiFileProgress;
  in_RDI[0x29] = MultiFileGetPartitionData;
  in_RDI[0x2a] = MultiFileGetBindInfo;
  *(undefined1 *)((long)in_RDI + 0x199) = 1;
  in_RDI[0x24] = MultiFileComplexFilterPushdown;
  in_RDI[0x2e] = MultiFileGetPartitionInfo;
  in_RDI[0x30] = MultiFileGetVirtualColumns;
  in_RDI[0x27] = MultiFileDynamicToString_abi_cxx11_;
  MultiFileReader::AddParameters(in_stack_00000100);
  return;
}

Assistant:

explicit MultiFileFunction(string name_p)
	    : TableFunction(std::move(name_p), {LogicalType::VARCHAR}, MultiFileScan, MultiFileBind, MultiFileInitGlobal,
	                    MultiFileInitLocal) {
		cardinality = MultiFileCardinality;
		table_scan_progress = MultiFileProgress;
		get_partition_data = MultiFileGetPartitionData;
		get_bind_info = MultiFileGetBindInfo;
		projection_pushdown = true;
		pushdown_complex_filter = MultiFileComplexFilterPushdown;
		get_partition_info = MultiFileGetPartitionInfo;
		get_virtual_columns = MultiFileGetVirtualColumns;
		dynamic_to_string = MultiFileDynamicToString;
		MultiFileReader::AddParameters(*this);
	}